

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkPipelineRenderingCreateInfoKHR *
Diligent::GraphicsPipelineDesc_To_VkPipelineRenderingCreateInfo
          (VkPipelineRenderingCreateInfoKHR *__return_storage_ptr__,
          GraphicsPipelineDesc *PipelineDesc,
          vector<VkFormat,_std::allocator<VkFormat>_> *ColorAttachmentFormats)

{
  TEXTURE_FORMAT TexFmt;
  VkFormat VVar1;
  reference pvVar2;
  VkFormat *pVVar3;
  TextureFormatAttribs *pTVar4;
  VkPipelineRenderingCreateInfoKHR *PipelineRenderingCI;
  TextureFormatAttribs *FmtAttribs;
  TEXTURE_FORMAT DSVFormat;
  TEXTURE_FORMAT RTVFormat;
  Uint32 rt;
  vector<VkFormat,_std::allocator<VkFormat>_> *ColorAttachmentFormats_local;
  GraphicsPipelineDesc *PipelineDesc_local;
  
  memset(__return_storage_ptr__,0,0x28);
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->viewMask = 0;
  __return_storage_ptr__->colorAttachmentCount = (uint)PipelineDesc->NumRenderTargets;
  std::vector<VkFormat,_std::allocator<VkFormat>_>::resize
            (ColorAttachmentFormats,(ulong)PipelineDesc->NumRenderTargets);
  for (FmtAttribs._4_4_ = 0; FmtAttribs._4_4_ < PipelineDesc->NumRenderTargets;
      FmtAttribs._4_4_ = FmtAttribs._4_4_ + 1) {
    VVar1 = TexFormatToVkFormat(PipelineDesc->RTVFormats[FmtAttribs._4_4_]);
    pvVar2 = std::vector<VkFormat,_std::allocator<VkFormat>_>::operator[]
                       (ColorAttachmentFormats,(ulong)FmtAttribs._4_4_);
    *pvVar2 = VVar1;
  }
  pVVar3 = std::vector<VkFormat,_std::allocator<VkFormat>_>::data(ColorAttachmentFormats);
  __return_storage_ptr__->pColorAttachmentFormats = pVVar3;
  TexFmt = PipelineDesc->DSVFormat;
  if (TexFmt != TEX_FORMAT_UNKNOWN) {
    VVar1 = TexFormatToVkFormat(TexFmt);
    __return_storage_ptr__->depthAttachmentFormat = VVar1;
    pTVar4 = GetTextureFormatAttribs(TexFmt);
    if (pTVar4->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) {
      __return_storage_ptr__->stencilAttachmentFormat =
           __return_storage_ptr__->depthAttachmentFormat;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

VkPipelineRenderingCreateInfoKHR GraphicsPipelineDesc_To_VkPipelineRenderingCreateInfo(const GraphicsPipelineDesc& PipelineDesc,
                                                                                       std::vector<VkFormat>&      ColorAttachmentFormats)
{
    VkPipelineRenderingCreateInfoKHR PipelineRenderingCI{};
    PipelineRenderingCI.sType    = VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR;
    PipelineRenderingCI.pNext    = nullptr;
    PipelineRenderingCI.viewMask = 0;

    PipelineRenderingCI.colorAttachmentCount = PipelineDesc.NumRenderTargets;
    ColorAttachmentFormats.resize(PipelineDesc.NumRenderTargets);
    for (Uint32 rt = 0; rt < PipelineDesc.NumRenderTargets; ++rt)
    {
        TEXTURE_FORMAT RTVFormat   = PipelineDesc.RTVFormats[rt];
        ColorAttachmentFormats[rt] = TexFormatToVkFormat(RTVFormat);
    }
    PipelineRenderingCI.pColorAttachmentFormats = ColorAttachmentFormats.data();

    TEXTURE_FORMAT DSVFormat = PipelineDesc.DSVFormat;
    if (DSVFormat != TEX_FORMAT_UNKNOWN)
    {
        PipelineRenderingCI.depthAttachmentFormat = TexFormatToVkFormat(DSVFormat);
        const TextureFormatAttribs& FmtAttribs    = GetTextureFormatAttribs(DSVFormat);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            PipelineRenderingCI.stencilAttachmentFormat = PipelineRenderingCI.depthAttachmentFormat;
        }
    }

    return PipelineRenderingCI;
}